

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  Posf *pPVar2;
  Posf *pPVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  uInt uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uInt uVar11;
  uint uVar12;
  Bytef *pBVar13;
  IPos cur_match;
  bool bVar14;
  bool bVar15;
  
  cur_match = 0;
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        return need_more;
      }
      if (s->lookahead == 0) {
        uVar4 = s->block_start;
        if ((long)uVar4 < 0) {
          pBVar13 = (Bytef *)0x0;
        }
        else {
          pBVar13 = s->window + (uVar4 & 0xffffffff);
        }
        cm_zlib__tr_flush_block(s,(charf *)pBVar13,s->strstart - uVar4,(uint)(flush == 4));
        s->block_start = (ulong)s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out != 0) {
          return (uint)(flush == 4) * 2 + block_done;
        }
        return (uint)(flush == 4) * 2;
      }
    }
    if (2 < s->lookahead) {
      uVar6 = s->strstart;
      uVar10 = ((uint)s->window[uVar6 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) &
               s->hash_mask;
      s->ins_h = uVar10;
      pPVar2 = s->head;
      uVar1 = pPVar2[uVar10];
      cur_match = (IPos)uVar1;
      s->prev[s->w_mask & uVar6] = uVar1;
      pPVar2[uVar10] = (Posf)uVar6;
    }
    if ((cur_match != 0) && (uVar6 = s->strstart - cur_match, uVar6 <= s->w_size - 0x106)) {
      if ((s->strategy & 0xfffffffeU) == 2) {
        if (uVar6 != 1 || s->strategy != 3) goto LAB_0050c0e6;
        uVar7 = longest_match_fast(s,cur_match);
      }
      else {
        uVar7 = longest_match(s,cur_match);
      }
      s->match_length = uVar7;
    }
LAB_0050c0e6:
    if (s->match_length < 3) {
      bVar5 = s->window[s->strstart];
      uVar6 = s->last_lit;
      s->d_buf[uVar6] = 0;
      s->last_lit = uVar6 + 1;
      s->l_buf[uVar6] = bVar5;
      s->dyn_ltree[bVar5].fc.freq = s->dyn_ltree[bVar5].fc.freq + 1;
      bVar15 = s->last_lit == s->lit_bufsize - 1;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
    }
    else {
      bVar5 = (char)s->match_length - 3;
      iVar8 = s->strstart - s->match_start;
      uVar6 = s->last_lit;
      s->d_buf[uVar6] = (ushf)iVar8;
      s->last_lit = uVar6 + 1;
      s->l_buf[uVar6] = bVar5;
      s->dyn_ltree[(ulong)""[bVar5] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar5] + 0x101].fc.freq + 1;
      uVar9 = iVar8 - 1;
      uVar10 = uVar9 & 0xffff;
      uVar6 = (uVar10 >> 7) + 0x100;
      if (uVar10 < 0x100) {
        uVar6 = uVar9;
      }
      s->dyn_dtree[""[uVar6 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar6 & 0xffff]].fc.freq + 1;
      bVar15 = s->last_lit == s->lit_bufsize - 1;
      uVar6 = s->match_length;
      uVar10 = s->lookahead - uVar6;
      s->lookahead = uVar10;
      if (uVar10 < 3 || s->max_lazy_match < uVar6) {
        uVar7 = s->strstart;
        uVar10 = uVar7 + uVar6;
        s->strstart = uVar10;
        s->match_length = 0;
        uVar10 = (uint)s->window[uVar10];
        s->ins_h = uVar10;
        s->ins_h = ((uint)s->window[uVar7 + uVar6 + 1] ^ uVar10 << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
      }
      else {
        s->match_length = uVar6 - 1;
        uVar7 = s->hash_shift;
        pBVar13 = s->window;
        uVar10 = s->hash_mask;
        pPVar2 = s->head;
        pPVar3 = s->prev;
        uVar9 = s->w_mask;
        uVar12 = s->ins_h;
        uVar11 = uVar6 - 2;
        uVar6 = s->strstart + 1;
        do {
          s->strstart = uVar6;
          uVar12 = ((uint)pBVar13[uVar6 + 2] ^ uVar12 << ((byte)uVar7 & 0x1f)) & uVar10;
          s->ins_h = uVar12;
          uVar1 = pPVar2[uVar12];
          cur_match = (IPos)uVar1;
          pPVar3[uVar9 & uVar6] = uVar1;
          pPVar2[uVar12] = (Posf)uVar6;
          s->match_length = uVar11;
          uVar6 = uVar6 + 1;
          bVar14 = uVar11 != 0;
          uVar11 = uVar11 - 1;
        } while (bVar14);
        s->strstart = uVar6;
      }
    }
    if (bVar15) {
      uVar4 = s->block_start;
      if ((long)uVar4 < 0) {
        pBVar13 = (Bytef *)0x0;
      }
      else {
        pBVar13 = s->window + (uVar4 & 0xffffffff);
      }
      cm_zlib__tr_flush_block(s,(charf *)pBVar13,s->strstart - uVar4,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head = NIL; /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#ifdef FASTEST
            if ((s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) ||
                (s->strategy == Z_RLE && s->strstart - hash_head == 1)) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#else
            if (s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) {
                s->match_length = longest_match (s, hash_head);
            } else if (s->strategy == Z_RLE && s->strstart - hash_head == 1) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#endif
            /* longest_match() or longest_match_fast() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    INSERT_STRING(s, s->strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;
                s->ins_h = s->window[s->strstart];
                UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}